

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

bool __thiscall aiFace::operator==(aiFace *this,aiFace *o)

{
  uint local_24;
  uint i;
  aiFace *o_local;
  aiFace *this_local;
  
  if (this->mIndices == o->mIndices) {
    this_local._7_1_ = true;
  }
  else if ((this->mIndices == (uint *)0x0) || (this->mNumIndices == o->mNumIndices)) {
    if (this->mIndices == (uint *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      for (local_24 = 0; local_24 < this->mNumIndices; local_24 = local_24 + 1) {
        if (this->mIndices[local_24] != o->mIndices[local_24]) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator== (const aiFace& o) const {
        if (mIndices == o.mIndices) {
            return true;
        }

        if (nullptr != mIndices && mNumIndices != o.mNumIndices) {
            return false;
        }

        if (nullptr == mIndices) {
            return false;
        }

        for (unsigned int i = 0; i < this->mNumIndices; ++i) {
            if (mIndices[i] != o.mIndices[i]) {
                return false;
            }
        }

        return true;
    }